

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_tracker_connection.hpp
# Opt level: O1

void __thiscall
libtorrent::aux::udp_tracker_connection::~udp_tracker_connection(udp_tracker_connection *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pcVar3;
  
  (this->super_tracker_connection).super_timeout_handler._vptr_timeout_handler =
       (_func_int **)&PTR_on_timeout_004f7b40;
  pbVar2 = (this->m_endpoints).
           super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar2 != (pointer)0x0) {
    operator_delete(pbVar2,(long)(this->m_endpoints).
                                 super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pbVar2);
  }
  pcVar3 = (this->m_hostname)._M_dataplus._M_p;
  paVar1 = &(this->m_hostname).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  tracker_connection::~tracker_connection(&this->super_tracker_connection);
  operator_delete(this,0x228);
  return;
}

Assistant:

class TORRENT_EXTRA_EXPORT udp_tracker_connection: public tracker_connection
	{
	friend class tracker_manager;
	public:

		udp_tracker_connection(
			io_context& ios
			, tracker_manager& man
			, tracker_request const& req
			, std::weak_ptr<request_callback> c);

		void start() override;
		void close() override;

		std::uint32_t transaction_id() const { return m_transaction_id; }

	private:

		enum class action_t : std::uint8_t
		{
			connect,
			announce,
			scrape,
			error
		};

		std::shared_ptr<udp_tracker_connection> shared_from_this()
		{
			return std::static_pointer_cast<udp_tracker_connection>(
				tracker_connection::shared_from_this());
		}

		void update_transaction_id();

		void name_lookup(error_code const& error
			, std::vector<address> const& addresses, int port);
		void start_announce();

		bool on_receive(udp::endpoint const& ep, span<char const> buf);
		bool on_receive_hostname(string_view hostname, span<char const> buf);
		bool on_connect_response(span<char const> buf);
		bool on_announce_response(span<char const> buf);
		bool on_scrape_response(span<char const> buf);

		// wraps tracker_connection::fail
		void fail(error_code const& ec
			, operation_t op
			, char const* msg = ""
			, seconds32 interval = seconds32(0)
			, seconds32 min_interval = seconds32(30));

		void send_udp_connect();
		void send_udp_announce();
		void send_udp_scrape();

		void on_timeout(error_code const& ec) override;

		std::string m_hostname;
		std::vector<tcp::endpoint> m_endpoints;

		struct connection_cache_entry
		{
			std::int64_t connection_id;
			time_point expires;
		};

		static std::map<address, connection_cache_entry> m_connection_cache;
		static std::mutex m_cache_mutex;

		udp::endpoint m_target;

		std::uint32_t m_transaction_id;
		int m_attempts;

		action_t m_state;

		bool m_abort;
	}